

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_FlushPendingBuffers(FAudioSourceVoice *voice)

{
  long lVar1;
  long *in_RDI;
  FAudioBufferEntry *entry;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x12f9fa);
  while (in_RDI[0x27] != 0) {
    lVar1 = in_RDI[0x27];
    in_RDI[0x27] = *(long *)(in_RDI[0x27] + 0x38);
    if ((in_RDI[0x22] != 0) && (*(long *)in_RDI[0x22] != 0)) {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x12fa6c);
      (**(code **)in_RDI[0x22])(in_RDI[0x22],*(undefined8 *)(lVar1 + 0x24));
      FAudio_PlatformLockMutex((FAudioMutex)0x12faa3);
    }
    (**(code **)(*in_RDI + 0xc0))(lVar1);
  }
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12facf);
  return;
}

Assistant:

static void FAudio_INTERNAL_FlushPendingBuffers(FAudioSourceVoice *voice)
{
	FAudioBufferEntry *entry;

	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)

	/* Remove pending flushed buffers and send an event for each one */
	while (voice->src.flushList != NULL)
	{
		entry = voice->src.flushList;
		voice->src.flushList = voice->src.flushList->next;

		if (voice->src.callback != NULL && voice->src.callback->OnBufferEnd != NULL)
		{
			FAudio_PlatformUnlockMutex(voice->audio->sourceLock);
			LOG_MUTEX_UNLOCK(voice->audio, voice->audio->sourceLock)

			voice->src.callback->OnBufferEnd(
				voice->src.callback,
				entry->buffer.pContext
			);

			FAudio_PlatformLockMutex(voice->audio->sourceLock);
			LOG_MUTEX_LOCK(voice->audio, voice->audio->sourceLock)
		}
		voice->audio->pFree(entry);
	}

	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
}